

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_points_tree_decoder.h
# Opt level: O2

bool __thiscall
draco::FloatPointsTreeDecoder::DecodePointCloud<draco::PointAttributeVectorOutputIterator<float>>
          (FloatPointsTreeDecoder *this,DecoderBuffer *buffer,
          PointAttributeVectorOutputIterator<float> *out)

{
  bool bVar1;
  char *__ptr;
  size_t sStack_50;
  uint32_t decoded_version;
  int8_t method_number;
  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_> qpoints
  ;
  __normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
  local_20;
  
  qpoints.
  super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  qpoints.
  super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  qpoints.
  super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = DecoderBuffer::Decode<unsigned_int>(buffer,&decoded_version);
  if (bVar1) {
    if (decoded_version == 2) {
      bVar1 = DecodePointCloudKdTreeInternal(this,buffer,&qpoints);
LAB_00149f0c:
      if (bVar1 != false) {
        _method_number =
             qpoints.
             super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_20._M_current =
             qpoints.
             super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        DequantizePoints3<__gnu_cxx::__normal_iterator<draco::VectorD<unsigned_int,3>*,std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::PointAttributeVectorOutputIterator<float>>
                  ((__normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                    *)&method_number,&local_20,&this->qinfo_,out);
        bVar1 = true;
        goto LAB_00149f6c;
      }
    }
    else {
      if (decoded_version == 3) {
        bVar1 = DecoderBuffer::Decode<signed_char>(buffer,&method_number);
        if (!bVar1) goto LAB_00149f6a;
        this->method_ = method_number;
        if (method_number == '\x01') {
          bVar1 = DecodePointCloudKdTreeInternal(this,buffer,&qpoints);
          goto LAB_00149f0c;
        }
        __ptr = "Method not supported. \n";
        sStack_50 = 0x17;
      }
      else {
        __ptr = "Version not supported. \n";
        sStack_50 = 0x18;
      }
      fwrite(__ptr,sStack_50,1,_stderr);
    }
  }
LAB_00149f6a:
  bVar1 = false;
LAB_00149f6c:
  std::
  _Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>::
  ~_Vector_base(&qpoints.
                 super__Vector_base<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
               );
  return bVar1;
}

Assistant:

bool FloatPointsTreeDecoder::DecodePointCloud(DecoderBuffer *buffer,
                                              OutputIteratorT &out) {
  std::vector<Point3ui> qpoints;

  uint32_t decoded_version;
  if (!buffer->Decode(&decoded_version)) {
    return false;
  }

  if (decoded_version == 3) {
    int8_t method_number;
    if (!buffer->Decode(&method_number)) {
      return false;
    }

    method_ = method_number;

    if (method_ == KDTREE) {
      if (!DecodePointCloudKdTreeInternal(buffer, &qpoints)) {
        return false;
      }
    } else {  // Unsupported method.
      fprintf(stderr, "Method not supported. \n");
      return false;
    }
  } else if (decoded_version == 2) {  // Version 2 only uses KDTREE method.
    if (!DecodePointCloudKdTreeInternal(buffer, &qpoints)) {
      return false;
    }
  } else {  // Unsupported version.
    fprintf(stderr, "Version not supported. \n");
    return false;
  }

  DequantizePoints3(qpoints.begin(), qpoints.end(), qinfo_, out);
  return true;
}